

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges.cpp
# Opt level: O1

void __thiscall
sdf_tools::sdf::SdfEdges::SdfEdges
          (SdfEdges *this,vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_> *edges,
          bool inside,int nsamples)

{
  real2 rVar1;
  pointer prVar2;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  
  (this->super_Sdf)._vptr_Sdf = (_func_int **)&PTR__SdfEdges_00151fe0;
  prVar2 = (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_start =
       (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_finish = prVar2;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->insideSign_ = (int)CONCAT71(in_register_00000011,inside) - 1U | 1;
  this->nsamples_ = nsamples;
  (this->gen_)._M_x[0] = 0xc0ffee;
  uVar4 = 0xc0ffee;
  lVar3 = 6;
  do {
    uVar4 = (ulong)((((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3) - 5);
    (this->gen_)._M_x[lVar3 + -5] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x275);
  (this->gen_)._M_p = 0x270;
  rVar1 = findOrigin_(this);
  this->origin_ = rVar1;
  return;
}

Assistant:

SdfEdges::SdfEdges(std::vector<real2> edges, bool inside, int nsamples) :
    edges_(std::move(edges)),
    insideSign_(inside ? 1 : -1),
    nsamples_(nsamples)
{
    origin_ = findOrigin_();
}